

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFGS.cpp
# Opt level: O2

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::BFGS::getUpdatedDirection
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,BFGS *this,
          Problem *P,RealType param_2,DynamicVector<double,_std::allocator<double>_> *oldGradient)

{
  DynamicRectMatrix<double> *m;
  double dVar1;
  double **ppdVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  LineSearch *pLVar6;
  ulong uVar7;
  uint nrow;
  size_type sVar8;
  ulong uVar9;
  size_type sVar10;
  size_t i_4;
  size_t j;
  ulong uVar11;
  size_t j_2;
  size_t j_1;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  DynamicVector<double,_std::allocator<double>_> diffGradient;
  DynamicVector<double,_std::allocator<double>_> diffGradientWithHessianApplied;
  allocator_type local_a9;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_88;
  _Vector_base<double,_std::allocator<double>_> local_70;
  double local_58;
  double dStack_50;
  DynamicRectMatrix<double> local_40;
  
  m = &this->inverseHessian_;
  if ((this->inverseHessian_).nrow_ == 0) {
    nrow = (uint)((ulong)((long)(P->currentValue_).data_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(P->currentValue_).data_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
    OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
              ((DynamicRectMatrix<double> *)&local_a8,nrow,nrow,0.0);
    OpenMD::DynamicRectMatrix<double>::operator=(&local_40,m);
    OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
    OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_a8);
    sVar8 = (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    ppdVar2 = m->data_;
    for (uVar7 = 0; sVar8 != uVar7; uVar7 = uVar7 + 1) {
      ppdVar2[uVar7 & 0xffffffff][uVar7 & 0xffffffff] = 1.0;
    }
  }
  else {
    sVar8 = (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,sVar8,
             (value_type_conflict1 *)&local_70,&local_a9);
  OpenMD::operator-((DynamicVector<double,_std::allocator<double>_> *)&local_70,
                    &((this->super_LineSearchBasedMethod).lineSearch_)->gradient_,oldGradient);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)&local_a8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  uVar7 = (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start >> 3;
  ppdVar2 = m->data_;
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    pdVar3 = ppdVar2[uVar9 & 0xffffffff];
    dVar12 = local_88._M_impl.super__Vector_impl_data._M_start[uVar9];
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      dVar12 = dVar12 + pdVar3[uVar11 & 0xffffffff] *
                        (double)local_a8._M_impl.super__Vector_impl_data._M_start[uVar11];
      local_88._M_impl.super__Vector_impl_data._M_start[uVar9] = dVar12;
    }
  }
  dVar13 = 0.0;
  dVar14 = 0.0;
  dVar12 = 0.0;
  dVar15 = 0.0;
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pdVar3 = (double *)local_a8._M_impl.super__Vector_impl_data._M_start[uVar9];
    dVar1 = (((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_).data_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar9];
    dVar12 = dVar12 + dVar1 * (double)pdVar3;
    dVar15 = dVar15 + local_88._M_impl.super__Vector_impl_data._M_start[uVar9] * (double)pdVar3;
    dVar13 = dVar13 + (double)pdVar3 * (double)pdVar3;
    dVar14 = dVar14 + dVar1 * dVar1;
  }
  dVar14 = dVar14 * dVar13 * 1e-08;
  if (dVar14 < 0.0) {
    local_58 = dVar12;
    dStack_50 = dVar15;
    dVar14 = sqrt(dVar14);
    dVar12 = local_58;
    dVar15 = dStack_50;
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  pdVar4 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (dVar12 <= dVar14) {
    sVar8 = (long)pdVar5 - (long)pdVar4 >> 3;
  }
  else {
    sVar8 = (long)pdVar5 - (long)pdVar4 >> 3;
    pLVar6 = (this->super_LineSearchBasedMethod).lineSearch_;
    for (sVar10 = 0; sVar8 != sVar10; sVar10 = sVar10 + 1) {
      local_a8._M_impl.super__Vector_impl_data._M_start[sVar10] =
           (double)((pLVar6->searchDirection_).data_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar10] * (1.0 / dVar12) +
                   local_88._M_impl.super__Vector_impl_data._M_start[sVar10] * (-1.0 / dVar15));
    }
    pLVar6 = (this->super_LineSearchBasedMethod).lineSearch_;
    ppdVar2 = (this->inverseHessian_).data_;
    for (uVar7 = 0; uVar7 != sVar8; uVar7 = uVar7 + 1) {
      pdVar4 = (pLVar6->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar3 = ppdVar2[uVar7 & 0xffffffff];
      for (uVar9 = 0; sVar8 != uVar9; uVar9 = uVar9 + 1) {
        uVar11 = uVar9 & 0xffffffff;
        dVar13 = pdVar4[uVar7] * (1.0 / dVar12) * pdVar4[uVar9] + pdVar3[uVar11];
        pdVar3[uVar11] = dVar13;
        dVar13 = local_88._M_impl.super__Vector_impl_data._M_start[uVar7] * (-1.0 / dVar15) *
                 local_88._M_impl.super__Vector_impl_data._M_start[uVar9] + dVar13;
        pdVar3[uVar11] = dVar13;
        pdVar3[uVar11] =
             (double)local_a8._M_impl.super__Vector_impl_data._M_start[uVar7] * dVar15 *
             (double)local_a8._M_impl.super__Vector_impl_data._M_start[uVar9] + dVar13;
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,sVar8,(allocator_type *)&local_70);
  uVar7 = (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start >> 3;
  pdVar4 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar6 = (this->super_LineSearchBasedMethod).lineSearch_;
  ppdVar2 = (this->inverseHessian_).data_;
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    pdVar4[uVar9] = 0.0;
    pdVar3 = ppdVar2[uVar9 & 0xffffffff];
    pdVar5 = (pLVar6->gradient_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar12 = 0.0;
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      dVar12 = dVar12 - pdVar3[uVar11 & 0xffffffff] * pdVar5[uVar11];
      pdVar4[uVar9] = dVar12;
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType> BFGS::getUpdatedDirection(
      const Problem& P, RealType, const DynamicVector<RealType>& oldGradient) {
    if (inverseHessian_.getNRow() == 0) {
      // first time in this update, we create needed structures
      inverseHessian_ = DynamicRectMatrix<RealType>(
          P.currentValue().size(), P.currentValue().size(), 0.);
      for (size_t i = 0; i < P.currentValue().size(); ++i)
        inverseHessian_(i, i) = 1.;
    }

    DynamicVector<RealType> diffGradient;
    DynamicVector<RealType> diffGradientWithHessianApplied(
        P.currentValue().size(), 0.);

    diffGradient = lineSearch_->lastGradient() - oldGradient;
    for (size_t i = 0; i < P.currentValue().size(); ++i)
      for (size_t j = 0; j < P.currentValue().size(); ++j)
        diffGradientWithHessianApplied[i] +=
            inverseHessian_(i, j) * diffGradient[j];

    double fac, fae, fad;
    double sumdg, sumxi;

    fac = fae = sumdg = sumxi = 0.;
    for (size_t i = 0; i < P.currentValue().size(); ++i) {
      fac += diffGradient[i] * lineSearch_->searchDirection()[i];
      fae += diffGradient[i] * diffGradientWithHessianApplied[i];
      sumdg += std::pow(diffGradient[i], 2.);
      sumxi += std::pow(lineSearch_->searchDirection()[i], 2.);
    }

    if (fac > std::sqrt(1e-8 * sumdg *
                        sumxi))  // skip update if fac not sufficiently positive
    {
      fac = 1.0 / fac;
      fad = 1.0 / fae;

      for (size_t i = 0; i < P.currentValue().size(); ++i)
        diffGradient[i] = fac * lineSearch_->searchDirection()[i] -
                          fad * diffGradientWithHessianApplied[i];

      for (size_t i = 0; i < P.currentValue().size(); ++i)
        for (size_t j = 0; j < P.currentValue().size(); ++j) {
          inverseHessian_(i, j) += fac * lineSearch_->searchDirection()[i] *
                                   lineSearch_->searchDirection()[j];
          inverseHessian_(i, j) -= fad * diffGradientWithHessianApplied[i] *
                                   diffGradientWithHessianApplied[j];
          inverseHessian_(i, j) += fae * diffGradient[i] * diffGradient[j];
        }
    }
    // else
    //  throw "BFGS: FAC not sufficiently positive";

    DynamicVector<RealType> direction(P.currentValue().size());
    for (size_t i = 0; i < P.currentValue().size(); ++i) {
      direction[i] = 0.0;
      for (size_t j = 0; j < P.currentValue().size(); ++j)
        direction[i] -= inverseHessian_(i, j) * lineSearch_->lastGradient()[j];
    }

    return direction;
  }